

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O3

void __thiscall QAbstractButton::setChecked(QAbstractButton *this,bool checked)

{
  byte bVar1;
  QAbstractButtonPrivate *this_00;
  QButtonGroupPrivate *this_01;
  byte bVar2;
  QAbstractButton *pQVar3;
  int *piVar4;
  long in_FS_OFFSET;
  code *local_58;
  undefined8 local_50;
  QAbstractButton *pQStack_48;
  undefined8 local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8;
  bVar2 = this_00->field_0x28c;
  if (((bVar2 & 1) == 0) || (((bVar2 & 2) == 0) != checked)) {
    if ((bVar2 & 0x20) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        (**(code **)(*(long *)&this->super_QWidget + 0x1a8))(this);
        return;
      }
      goto LAB_003bd6e4;
    }
    goto LAB_003bd6c7;
  }
  bVar2 = 2;
  if (checked) {
LAB_003bd5ab:
    piVar4 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
    bVar1 = this_00->field_0x28c;
    bVar2 = bVar1 & 0xfd | bVar2;
    this_00->field_0x28c = bVar2;
    if ((bVar1 & 0x20) == 0) {
      (**(code **)(*(long *)&this->super_QWidget + 0x1a8))(this);
      bVar2 = this_00->field_0x28c;
    }
    if ((bVar2 & 0x20) == 0) {
      QWidget::update(*(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8);
    }
    if (piVar4 != (int *)0x0) {
      if (checked && piVar4[1] != 0) {
        QAbstractButtonPrivate::notifyChecked(this_00);
      }
      if (piVar4[1] != 0) {
        QAbstractButtonPrivate::emitToggled(this_00,checked);
      }
      if (piVar4[1] != 0) {
        local_40 = 0xaaaaaaaaffffffff;
        local_58 = QCss::ValueExtractor::extractGeometry;
        local_38 = 0x40;
        local_50 = 0xaaaaaaaa0000800a;
        pQStack_48 = this;
        QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
        QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
                  ((QAccessibleStateChangeEvent *)&local_58);
      }
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        operator_delete(piVar4);
      }
    }
  }
  else {
    pQVar3 = QAbstractButtonPrivate::queryCheckedButton(this_00);
    if (pQVar3 != this) {
LAB_003bd5a8:
      bVar2 = 0;
      goto LAB_003bd5ab;
    }
    if (this_00->group == (QButtonGroup *)0x0) {
      if ((this_00->field_0x28c & 8) == 0) goto LAB_003bd5a8;
    }
    else {
      this_01 = *(QButtonGroupPrivate **)&this_00->group->field_0x8;
      if (this_01->exclusive == false) {
        QButtonGroupPrivate::detectCheckedButton(this_01);
        goto LAB_003bd5a8;
      }
    }
  }
LAB_003bd6c7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_003bd6e4:
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::setChecked(bool checked)
{
    Q_D(QAbstractButton);
    if (!d->checkable || d->checked == checked) {
        if (!d->blockRefresh)
            checkStateSet();
        return;
    }

    if (!checked && d->queryCheckedButton() == this) {
        // the checked button of an exclusive or autoexclusive group cannot be  unchecked
#if QT_CONFIG(buttongroup)
        if (d->group ? d->group->d_func()->exclusive : d->autoExclusive)
            return;
        if (d->group)
            d->group->d_func()->detectCheckedButton();
#else
        if (d->autoExclusive)
            return;
#endif
    }

    QPointer<QAbstractButton> guard(this);

    d->checked = checked;
    if (!d->blockRefresh)
        checkStateSet();
    d->refresh();

    if (guard && checked)
        d->notifyChecked();
    if (guard)
        d->emitToggled(checked);

#if QT_CONFIG(accessibility)
    if (guard) {
        QAccessible::State s;
        s.checked = true;
        QAccessibleStateChangeEvent event(this, s);
        QAccessible::updateAccessibility(&event);
    }
#endif
}